

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::Fl_Help_View(Fl_Help_View *this,int xx,int yy,int ww,int hh,char *l)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *l_local;
  int hh_local;
  int ww_local;
  int yy_local;
  int xx_local;
  Fl_Help_View *this_local;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,xx,yy,ww,hh,l);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Help_View_002ebdc8
  ;
  Fl_Help_Font_Stack::Fl_Help_Font_Stack(&this->fstack_);
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(&this->scrollbar_,(xx + ww) - iVar1,yy,iVar2,hh - iVar3,(char *)0x0);
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(&this->hscrollbar_,xx,(yy + hh) - iVar1,ww - iVar2,iVar3,(char *)0x0);
  Fl_Widget::color((Fl_Widget *)this,7,0xf);
  this->title_[0] = '\0';
  this->defcolor_ = 0;
  this->bgcolor_ = 0x31;
  this->textcolor_ = 0;
  this->linkcolor_ = 0xf;
  this->textfont_ = 8;
  this->textsize_ = 0xc;
  this->value_ = (char *)0x0;
  this->ablocks_ = 0;
  this->nblocks_ = 0;
  this->blocks_ = (Fl_Help_Block *)0x0;
  this->link_ = (Fl_Help_Func *)0x0;
  this->alinks_ = 0;
  this->nlinks_ = 0;
  this->links_ = (Fl_Help_Link *)0x0;
  this->atargets_ = 0;
  this->ntargets_ = 0;
  this->targets_ = (Fl_Help_Target *)0x0;
  this->directory_[0] = '\0';
  this->filename_[0] = '\0';
  this->topline_ = 0;
  this->leftline_ = 0;
  this->size_ = 0;
  this->hsize_ = 0;
  this->scrollbar_size_ = 0;
  Fl_Scrollbar::value(&this->scrollbar_,0,hh,0,1);
  Fl_Valuator::step((Fl_Valuator *)&this->scrollbar_,8.0);
  Fl_Widget::show((Fl_Widget *)&this->scrollbar_);
  Fl_Widget::callback((Fl_Widget *)&this->scrollbar_,scrollbar_callback);
  Fl_Scrollbar::value(&this->hscrollbar_,0,ww,0,1);
  Fl_Valuator::step((Fl_Valuator *)&this->hscrollbar_,8.0);
  Fl_Widget::show((Fl_Widget *)&this->hscrollbar_);
  Fl_Widget::callback((Fl_Widget *)&this->hscrollbar_,hscrollbar_callback);
  Fl_Widget::type((Fl_Widget *)&this->hscrollbar_,'\x01');
  Fl_Group::end(&this->super_Fl_Group);
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)(uint)xx,(ulong)(uint)yy,(ulong)(uint)ww,(ulong)(uint)hh);
  return;
}

Assistant:

Fl_Help_View::Fl_Help_View(int        xx,	// I - Left position
                	   int        yy,	// I - Top position
			   int        ww,	// I - Width in pixels
			   int        hh,	// I - Height in pixels
			   const char *l)
    : Fl_Group(xx, yy, ww, hh, l),
      scrollbar_(xx + ww - Fl::scrollbar_size(), yy,
                 Fl::scrollbar_size(), hh - Fl::scrollbar_size()),
      hscrollbar_(xx, yy + hh - Fl::scrollbar_size(),
                  ww - Fl::scrollbar_size(), Fl::scrollbar_size())
{
  color(FL_BACKGROUND2_COLOR, FL_SELECTION_COLOR);

  title_[0]     = '\0';
  defcolor_     = FL_FOREGROUND_COLOR;
  bgcolor_      = FL_BACKGROUND_COLOR;
  textcolor_    = FL_FOREGROUND_COLOR;
  linkcolor_    = FL_SELECTION_COLOR;
  textfont_     = FL_TIMES;
  textsize_     = 12;
  value_        = NULL;

  ablocks_      = 0;
  nblocks_      = 0;
  blocks_       = (Fl_Help_Block *)0;

  link_         = (Fl_Help_Func *)0;

  alinks_       = 0;
  nlinks_       = 0;
  links_        = (Fl_Help_Link *)0;

  atargets_     = 0;
  ntargets_     = 0;
  targets_      = (Fl_Help_Target *)0;

  directory_[0] = '\0';
  filename_[0]  = '\0';

  topline_      = 0;
  leftline_     = 0;
  size_         = 0;
  hsize_        = 0;
  scrollbar_size_ = 0;

  scrollbar_.value(0, hh, 0, 1);
  scrollbar_.step(8.0);
  scrollbar_.show();
  scrollbar_.callback(scrollbar_callback);

  hscrollbar_.value(0, ww, 0, 1);
  hscrollbar_.step(8.0);
  hscrollbar_.show();
  hscrollbar_.callback(hscrollbar_callback);
  hscrollbar_.type(FL_HORIZONTAL);
  end();

  resize(xx, yy, ww, hh);
}